

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O2

void __thiscall units::addCustomCommodity(units *this,string *comm,uint32_t code)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  undefined1 local_24 [4];
  
  if ((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) {
    lVar1 = *(long *)this;
    lVar2 = *(long *)(this + 8);
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      iVar3 = tolower((int)*(char *)(lVar1 + lVar4));
      *(char *)(lVar1 + lVar4) = (char)iVar3;
    }
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::__cxx11::string&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)customCommodityNames_abi_cxx11_,local_24,this);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,unsigned_int&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)customCommodityCodes_abi_cxx11_,this,local_24);
  }
  return;
}

Assistant:

void addCustomCommodity(std::string comm, std::uint32_t code)
{
    if (allowCustomCommodities.load()) {
        std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
        customCommodityNames.emplace(code, comm);
        customCommodityCodes.emplace(comm, code);
    }
}